

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  char *pcVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  pointer ppVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Self local_8f0;
  _Base_ptr local_8e8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_8e0;
  iterator compIt;
  string local_8b8;
  undefined1 local_898 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_720 [8];
  cmArchiveWrite archive;
  string local_638 [32];
  undefined1 local_618 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_4a0 [8];
  cmGeneratedFileStream gf;
  ostringstream local_238 [8];
  ostringstream cmCPackLog_msg;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  value_type local_38;
  cmCPackArchiveGenerator *local_18;
  cmCPackArchiveGenerator *this_local;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  local_18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::__cxx11::string::string
            ((string *)&local_38,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  std::__cxx11::string::operator+=((string *)pvVar4,"/");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CPACK_ARCHIVE_FILE_NAME",&local_69);
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CPACK_ARCHIVE_FILE_NAME",&local_91);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_90);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    std::__cxx11::string::operator+=((string *)pvVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"CPACK_PACKAGE_FILE_NAME",&local_b9);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_b8);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    std::__cxx11::string::operator+=((string *)pvVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  std::__cxx11::string::operator+=((string *)pvVar4,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::ostringstream::ostringstream(local_238);
  poVar6 = std::operator<<((ostream *)local_238,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xd8,pcVar5);
  std::__cxx11::string::~string((string *)&gf.field_0x240);
  std::__cxx11::ostringstream::~ostringstream(local_238);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4a0,None);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_4a0,pcVar5,false,true);
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1b])(this,local_4a0);
  if (iVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
    poVar6 = std::operator<<((ostream *)local_618,"Problem to generate Header for archive < ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    poVar6 = std::operator<<(poVar6,(string *)pvVar4);
    poVar6 = std::operator<<(poVar6,">.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xd9,pcVar5);
    std::__cxx11::string::~string(local_638);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
    this_local._4_4_ = 0;
    archive.PermissionsMask.IsValueSet = true;
    archive.PermissionsMask._5_3_ = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_720,(ostream *)local_4a0,this->Compress,&this->ArchiveFormat)
    ;
    bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_720);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
      poVar6 = std::operator<<((ostream *)local_898,"Problem to create archive < ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
      poVar6 = std::operator<<(poVar6,(string *)pvVar4);
      poVar6 = std::operator<<(poVar6,">. ERROR =");
      cmArchiveWrite::GetError_abi_cxx11_(&local_8b8,(cmArchiveWrite *)local_720);
      poVar6 = std::operator<<(poVar6,(string *)&local_8b8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_8b8);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xd9,pcVar5);
      std::__cxx11::string::~string((string *)&compIt);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
      this_local._4_4_ = 0;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::_Rb_tree_iterator(&local_8e0);
      local_8e8 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::begin(&(this->super_cmCPackGenerator).Components);
      local_8e0._M_node = local_8e8;
      while( true ) {
        local_8f0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::end(&(this->super_cmCPackGenerator).Components);
        bVar2 = std::operator!=(&local_8e0,&local_8f0);
        if (!bVar2) break;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                 ::operator->(&local_8e0);
        addOneComponentToArchive(this,(cmArchiveWrite *)local_720,&ppVar7->second);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::operator++(&local_8e0);
      }
      this_local._4_4_ = 1;
    }
    archive.PermissionsMask.IsValueSet = true;
    archive.PermissionsMask._5_3_ = 0;
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_720);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4a0);
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.push_back(std::string(toplevel));
  packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileNames[0] += this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    packageFileNames[0] += this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  // The ALL COMPONENTS in ONE package case
  std::map<std::string, cmCPackComponent>::iterator compIt;
  for (compIt = this->Components.begin(); compIt != this->Components.end();
       ++compIt) {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive, &(compIt->second));
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}